

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_alt_helpers.cpp
# Opt level: O1

int mbedtls_rsa_validate_crt
              (mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *D,mbedtls_mpi *DP,mbedtls_mpi *DQ,
              mbedtls_mpi *QP)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi K;
  mbedtls_mpi L;
  mbedtls_mpi mStack_58;
  mbedtls_mpi local_48;
  mbedtls_mpi *local_38;
  
  local_38 = QP;
  mbedtls_mpi_init(&mStack_58);
  mbedtls_mpi_init(&local_48);
  if (DP == (mbedtls_mpi *)0x0) {
LAB_00349e87:
    if (DQ != (mbedtls_mpi *)0x0) {
      if (Q == (mbedtls_mpi *)0x0) goto LAB_00349f4d;
      iVar1 = mbedtls_mpi_sub_int(&mStack_58,Q,1);
      if (((iVar1 != 0) || (iVar1 = mbedtls_mpi_sub_mpi(&local_48,DQ,D), iVar1 != 0)) ||
         (iVar1 = mbedtls_mpi_mod_mpi(&local_48,&local_48,&mStack_58), iVar1 != 0))
      goto LAB_00349f52;
      iVar2 = mbedtls_mpi_cmp_int(&local_48,0);
      iVar1 = -0x4200;
      if (iVar2 != 0) goto LAB_00349f52;
    }
    if (local_38 == (mbedtls_mpi *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = -0x4080;
      if (((Q != (mbedtls_mpi *)0x0 && P != (mbedtls_mpi *)0x0) &&
          (iVar1 = mbedtls_mpi_mul_mpi(&mStack_58,local_38,Q), iVar1 == 0)) &&
         ((iVar1 = mbedtls_mpi_sub_int(&mStack_58,&mStack_58,1), iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_mod_mpi(&mStack_58,&mStack_58,P), iVar1 == 0)))) {
        iVar2 = mbedtls_mpi_cmp_int(&mStack_58,0);
        iVar1 = -0x4200;
        if (iVar2 == 0) {
          iVar1 = 0;
        }
      }
    }
  }
  else {
    if (P != (mbedtls_mpi *)0x0) {
      iVar1 = mbedtls_mpi_sub_int(&mStack_58,P,1);
      if (((iVar1 != 0) || (iVar1 = mbedtls_mpi_sub_mpi(&local_48,DP,D), iVar1 != 0)) ||
         (iVar1 = mbedtls_mpi_mod_mpi(&local_48,&local_48,&mStack_58), iVar1 != 0))
      goto LAB_00349f52;
      iVar2 = mbedtls_mpi_cmp_int(&local_48,0);
      iVar1 = -0x4200;
      if (iVar2 != 0) goto LAB_00349f52;
      goto LAB_00349e87;
    }
LAB_00349f4d:
    iVar1 = -0x4080;
  }
LAB_00349f52:
  if (((iVar1 != -0x4200) && (iVar1 != -0x4080)) && (iVar1 != 0)) {
    iVar1 = iVar1 + -0x4200;
  }
  mbedtls_mpi_free(&mStack_58);
  mbedtls_mpi_free(&local_48);
  return iVar1;
}

Assistant:

int mbedtls_rsa_validate_crt(const mbedtls_mpi *P,  const mbedtls_mpi *Q,
                             const mbedtls_mpi *D,  const mbedtls_mpi *DP,
                             const mbedtls_mpi *DQ, const mbedtls_mpi *QP)
{
    int ret = 0;

    mbedtls_mpi K, L;
    mbedtls_mpi_init(&K);
    mbedtls_mpi_init(&L);

    /* Check that DP - D == 0 mod P - 1 */
    if (DP != NULL) {
        if (P == NULL) {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, P, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&L, DP, D));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&L, &L, &K));

        if (mbedtls_mpi_cmp_int(&L, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /* Check that DQ - D == 0 mod Q - 1 */
    if (DQ != NULL) {
        if (Q == NULL) {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, Q, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&L, DQ, D));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&L, &L, &K));

        if (mbedtls_mpi_cmp_int(&L, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /* Check that QP * Q - 1 == 0 mod P */
    if (QP != NULL) {
        if (P == NULL || Q == NULL) {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&K, QP, Q));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, &K, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&K, &K, P));
        if (mbedtls_mpi_cmp_int(&K, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

cleanup:

    /* Wrap MPI error codes by RSA check failure error code */
    if (ret != 0 &&
        ret != MBEDTLS_ERR_RSA_KEY_CHECK_FAILED &&
        ret != MBEDTLS_ERR_RSA_BAD_INPUT_DATA) {
        ret += MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    mbedtls_mpi_free(&K);
    mbedtls_mpi_free(&L);

    return ret;
}